

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

bool goodform::convert<unsigned_short>(any *v,unsigned_short *dest)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  long *plVar4;
  byte *pbVar5;
  unsigned_short *puVar6;
  uint *puVar7;
  unsigned_long *puVar8;
  float *pfVar9;
  double *pdVar10;
  unsigned_short *dest_local;
  any *v_local;
  
  bVar1 = can_be<unsigned_short>(v);
  if (bVar1) {
    bVar1 = is<signed_char>(v);
    if (bVar1) {
      pcVar2 = get<signed_char>(v);
      *dest = (short)*pcVar2;
    }
    else {
      bVar1 = is<short>(v);
      if (bVar1) {
        puVar6 = (unsigned_short *)get<short>(v);
        *dest = *puVar6;
      }
      else {
        bVar1 = is<int>(v);
        if (bVar1) {
          piVar3 = get<int>(v);
          *dest = (unsigned_short)*piVar3;
        }
        else {
          bVar1 = is<long>(v);
          if (bVar1) {
            plVar4 = get<long>(v);
            *dest = (unsigned_short)*plVar4;
          }
          else {
            bVar1 = is<unsigned_char>(v);
            if (bVar1) {
              pbVar5 = get<unsigned_char>(v);
              *dest = (ushort)*pbVar5;
            }
            else {
              bVar1 = is<unsigned_short>(v);
              if (bVar1) {
                puVar6 = get<unsigned_short>(v);
                *dest = *puVar6;
              }
              else {
                bVar1 = is<unsigned_int>(v);
                if (bVar1) {
                  puVar7 = get<unsigned_int>(v);
                  *dest = (unsigned_short)*puVar7;
                }
                else {
                  bVar1 = is<unsigned_long>(v);
                  if (bVar1) {
                    puVar8 = get<unsigned_long>(v);
                    *dest = (unsigned_short)*puVar8;
                  }
                  else {
                    bVar1 = is<float>(v);
                    if (bVar1) {
                      pfVar9 = get<float>(v);
                      *dest = (unsigned_short)(int)*pfVar9;
                    }
                    else {
                      bVar1 = is<double>(v);
                      if (bVar1) {
                        pdVar10 = get<double>(v);
                        *dest = (unsigned_short)(int)*pdVar10;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    v_local._7_1_ = true;
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }